

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

FeatureOptions<wasm::Type::BasicType> * __thiscall
wasm::Random::FeatureOptions<wasm::Type::BasicType>::
add<wasm::Type::BasicType,wasm::Type::BasicType>
          (FeatureOptions<wasm::Type::BasicType> *this,FeatureSet feature,BasicType option,
          BasicType rest,BasicType rest_1)

{
  mapped_type *this_00;
  FeatureOptions<wasm::Type::BasicType> *pFVar1;
  BasicType rest_local_1;
  BasicType rest_local;
  BasicType option_local;
  FeatureOptions<wasm::Type::BasicType> *this_local;
  FeatureSet feature_local;
  
  rest_local_1 = option;
  _rest_local = this;
  this_local._4_4_ = feature.features;
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>_>
            ::operator[](&this->options,(key_type *)((long)&this_local + 4));
  std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>::push_back
            (this_00,&rest_local_1);
  pFVar1 = add<wasm::Type::BasicType>(this,this_local._4_4_,rest,rest_1);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }